

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *pFVar4;
  FadExpr<FadFuncCos<Fad<double>_>_> *pFVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_38;
  
  pFVar4 = this->left_;
  pFVar5 = (pFVar4->fadexpr_).right_;
  local_38 = -(pFVar5->fadexpr_).expr_.dx_.ptr_to_data[i];
  dVar6 = sin((pFVar5->fadexpr_).expr_.val_);
  dVar1 = (pFVar4->fadexpr_).left_.constant_;
  dVar7 = cos((this->right_->fadexpr_).expr_.val_);
  dVar2 = (this->right_->fadexpr_).expr_.dx_.ptr_to_data[i];
  dVar8 = sin((this->right_->fadexpr_).expr_.val_);
  dVar3 = (this->left_->fadexpr_).left_.constant_;
  dVar9 = cos((((this->left_->fadexpr_).right_)->fadexpr_).expr_.val_);
  return dVar7 * dVar6 * local_38 * dVar1 - dVar9 * dVar3 * dVar8 * dVar2;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}